

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O3

void contended_state_contend_loop
               (contended_state *cs,void *mu,_func_void_void_ptr *lock,_func_void_void_ptr *unlock)

{
  nsync_mu *mu_00;
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = testing_n(cs->t);
  mu_00 = &cs->start_done_mu;
  nsync::nsync_mu_rlock(mu_00);
  iVar3 = 0;
  nsync::nsync_mu_wait(mu_00,contended_state_may_start,cs,(_func_int_void_ptr_void_ptr *)0x0);
  nsync::nsync_mu_runlock(mu_00);
  if (0 < iVar1) {
    do {
      iVar2 = 10000;
      do {
        (*lock)(mu);
        cs->count = cs->count + 1;
        (*unlock)(mu);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      iVar3 = iVar3 + 10000;
    } while (iVar3 < iVar1);
  }
  nsync::nsync_mu_lock(mu_00);
  cs->not_yet_done = cs->not_yet_done + -1;
  nsync::nsync_mu_unlock(mu_00);
  return;
}

Assistant:

static void contended_state_contend_loop (contended_state *cs,
					  void *mu, void (*lock) (void *),
					  void (*unlock) (void *)) {
	int n = testing_n (cs->t);
	int j;
	int i;
	nsync_mu_rlock (&cs->start_done_mu);
	nsync_mu_wait (&cs->start_done_mu, &contended_state_may_start, cs, NULL);
	nsync_mu_runlock (&cs->start_done_mu);

	for (j = 0; j < n; j += 10000) {
		for (i = 0; i != 10000; i++) {
			(*lock) (mu);
			cs->count++;
			(*unlock) (mu);
		}
	}

	nsync_mu_lock (&cs->start_done_mu);
	cs->not_yet_done--;
	nsync_mu_unlock (&cs->start_done_mu);
}